

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledLifetimeResource.h
# Opt level: O3

void __thiscall
Rml::ControlledLifetimeResource<Rml::ElementInstancerPools>::Shutdown
          (ControlledLifetimeResource<Rml::ElementInstancerPools> *this)

{
  ElementInstancerPools *this_00;
  code *pcVar1;
  bool bVar2;
  
  if (this->pointer == (ElementInstancerPools *)0x0) {
    bVar2 = Assert("Shutting down resource that was not initialized, or has been shut down already."
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x3e);
    if (!bVar2) goto LAB_0022b86c;
  }
  if (this->intentionally_leaked == true) {
    bVar2 = Assert("Shutting down resource that was marked as leaked.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x3f);
    if (!bVar2) {
LAB_0022b86c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  this_00 = this->pointer;
  if (this_00 != (ElementInstancerPools *)0x0) {
    Pool<Rml::ElementText>::~Pool(&this_00->pool_text_default);
    Pool<Rml::Element>::~Pool(&this_00->pool_element);
  }
  operator_delete(this_00,0x50);
  this->pointer = (ElementInstancerPools *)0x0;
  return;
}

Assistant:

void Shutdown()
	{
		RMLUI_ASSERTMSG(pointer, "Shutting down resource that was not initialized, or has been shut down already.");
		RMLUI_ASSERTMSG(!intentionally_leaked, "Shutting down resource that was marked as leaked.");
		delete pointer;
		pointer = nullptr;
	}